

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clogger.h
# Opt level: O0

void __thiscall
CLogger::Info<int,int,int,int>
          (CLogger *this,string_view fmt,int *args,int *args_1,int *args_2,int *args_3)

{
  basic_string_view<char,_std::char_traits<char>_> s;
  format_string_t<int,_int,_int,_int> fmt_00;
  element_type *this_00;
  int *in_RDI;
  size_t in_R8;
  char *in_R9;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  logger *in_stack_ffffffffffffffa0;
  undefined1 local_38 [32];
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  spdlog::get(in_stack_ffffffffffffff78);
  this_00 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x5b3808);
  local_10 = &stack0xffffffffffffff88;
  local_18 = local_38;
  s._M_str = in_stack_ffffffffffffff80;
  s._M_len = (size_t)in_stack_ffffffffffffff78;
  ::fmt::v9::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            ((basic_string_view<char> *)this_00,s);
  local_8 = local_18;
  fmt_00.str_.size_ = in_R8;
  fmt_00.str_.data_ = in_R9;
  spdlog::logger::info<int,int,int,int>
            (in_stack_ffffffffffffffa0,fmt_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,in_RDI);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x5b38a4);
  return;
}

Assistant:

void Info(std::string_view fmt, Args &&...args)
	{
		spdlog::get("rs")->info(fmt, std::forward<Args>(args)...);
	}